

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_atrophy(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  char *txt;
  AFFECT_DATA af;
  AFFECT_DATA AStack_88;
  
  bVar1 = is_affected((CHAR_DATA *)vo,sn);
  if (bVar1) {
    if ((CHAR_DATA *)vo == ch) {
      txt = "You are already wasting away.\n\r";
    }
    else {
      txt = "They are already wasting away.\n\r";
    }
  }
  else {
    bVar1 = saves_spell(level,(CHAR_DATA *)vo,0x10);
    if (!bVar1) {
      bVar1 = str_cmp(race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                      super__Vector_impl_data._M_start[*(short *)((long)vo + 0x136)].name,"troll");
      if (bVar1) {
        init_affect(&AStack_88);
        AStack_88.where = 0;
        AStack_88.aftype = 0;
        AStack_88.type = (short)sn;
        AStack_88.duration =
             (short)(uint)((ulong)((long)level * 0x92492493) >> 0x22) - (short)(level >> 0x1f);
        AStack_88.location = 0x1d;
        iVar2 = (int)((ulong)((long)level * -0x2aaaaaab) >> 0x20);
        iVar2 = number_range(-3,(iVar2 >> 1) - (iVar2 >> 0x1f));
        AStack_88.modifier = (short)iVar2;
        AStack_88.mod_name = 0xf;
        AStack_88.level = (short)level;
        affect_to_char((CHAR_DATA *)vo,&AStack_88);
        send_to_char("You feel an intense pain as your body begins to waste away.\n\r",
                     (CHAR_DATA *)vo);
        act("$n looks very sick as $s body starts wasting away before your eyes!",(CHAR_DATA *)vo,
            (void *)0x0,(void *)0x0,0);
        return;
      }
    }
    txt = "Spell failed.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_atrophy(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected(victim, sn))
	{
		if (victim == ch)
			send_to_char("You are already wasting away.\n\r", ch);
		else
			send_to_char("They are already wasting away.\n\r", ch);

		return;
	}

	if (saves_spell(level, victim, DAM_OTHER) || !str_cmp(race_table[victim->race].name, "troll"))
	{
		send_to_char("Spell failed.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.duration = level / 7;
	af.location = APPLY_REGENERATION;
	af.modifier = number_range(-3, -level / 12);
	af.level = level;
	af.mod_name = MOD_REGEN;
	affect_to_char(victim, &af);

	send_to_char("You feel an intense pain as your body begins to waste away.\n\r", victim);
	act("$n looks very sick as $s body starts wasting away before your eyes!", victim, nullptr, nullptr, TO_ROOM);
}